

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# portable-file-dialogs.h
# Opt level: O0

void __thiscall
pfd::internal::file_dialog::file_dialog
          (file_dialog *this,type in_type,string *title,string *default_path,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *filters,opt options)

{
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __b;
  ulong uVar1;
  bool bVar2;
  bool bVar3;
  long lVar4;
  size_type sVar5;
  bool *pbVar6;
  ostream *this_00;
  int in_ESI;
  settings *in_RDI;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_R8;
  opt in_R9B;
  size_t i_2;
  string filter;
  size_t i_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> filename_arg;
  string_type pat;
  sregex_token_iterator end;
  sregex_token_iterator iter;
  bool has_filter;
  string filter_list;
  regex sep;
  size_t i;
  string patterns;
  string script;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  command;
  regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
  *in_stack_fffffffffffff798;
  flag in_flag;
  regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
  *in_stack_fffffffffffff7a0;
  value_type *in_stack_fffffffffffff7a8;
  string *in_stack_fffffffffffff7b0;
  char *in_stack_fffffffffffff7b8;
  string *in_stack_fffffffffffff7c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff7c8;
  allocator *paVar7;
  undefined8 in_stack_fffffffffffff7d0;
  undefined7 in_stack_fffffffffffff7d8;
  undefined1 in_stack_fffffffffffff7df;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff7e0;
  allocator *in_stack_fffffffffffff7e8;
  undefined8 in_stack_fffffffffffff7f0;
  undefined4 in_stack_fffffffffffff7f8;
  undefined4 in_stack_fffffffffffff7fc;
  regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
  *in_stack_fffffffffffff800;
  undefined7 in_stack_fffffffffffff808;
  undefined1 in_stack_fffffffffffff80f;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffff810;
  string *in_stack_fffffffffffff820;
  dialog *in_stack_fffffffffffff828;
  string *in_stack_fffffffffffff830;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffff838;
  executor *in_stack_fffffffffffff840;
  undefined7 in_stack_fffffffffffff868;
  undefined1 in_stack_fffffffffffff86f;
  undefined1 local_711 [33];
  string local_6f0 [32];
  string local_6d0 [32];
  string local_6b0 [32];
  regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
  *in_stack_fffffffffffff970;
  string *local_670;
  string local_668 [39];
  allocator local_641;
  string local_640 [39];
  allocator local_619;
  string local_618 [39];
  undefined1 local_5f1 [40];
  allocator local_5c9;
  string local_5c8 [39];
  allocator local_5a1;
  string local_5a0 [39];
  allocator local_579;
  string local_578 [39];
  allocator local_551;
  string local_550 [39];
  allocator local_529;
  string local_528 [39];
  allocator local_501;
  string local_500 [32];
  string local_4e0 [32];
  string local_4c0 [39];
  allocator local_499;
  string local_498 [32];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_478;
  undefined1 local_469 [40];
  allocator local_441;
  string local_440 [37];
  byte local_41b;
  byte local_41a;
  allocator local_419;
  string local_418 [32];
  string local_3f8 [39];
  allocator local_3d1;
  string local_3d0 [39];
  allocator local_3a9;
  string local_3a8 [32];
  string local_388 [32];
  string local_368 [32];
  string local_348 [32];
  string local_328 [32];
  string local_308 [39];
  allocator local_2e1;
  string local_2e0 [32];
  string local_2c0 [168];
  undefined8 local_218;
  undefined8 local_208;
  regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
  local_1f8;
  byte local_169;
  string local_168 [64];
  string local_128 [32];
  ulong local_108;
  string local_100 [32];
  string local_e0 [32];
  string local_c0 [32];
  string local_a0 [39];
  allocator local_79;
  string local_78 [79];
  opt local_29;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_28;
  int local_c;
  
  local_29 = in_R9B;
  local_28 = in_R8;
  local_c = in_ESI;
  dialog::dialog((dialog *)in_stack_fffffffffffff7a0);
  dialog::desktop_helper_abi_cxx11_
            ((dialog *)CONCAT17(in_stack_fffffffffffff86f,in_stack_fffffffffffff868));
  bVar2 = pfd::settings::is_osascript(in_RDI);
  if (!bVar2) {
    bVar2 = pfd::settings::is_zenity((settings *)in_stack_fffffffffffff7a0);
    if (bVar2) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_3d0,"--file-selection",&local_3d1);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)in_stack_fffffffffffff7a0,(value_type *)in_stack_fffffffffffff798);
      std::__cxx11::string::~string(local_3d0);
      std::allocator<char>::~allocator((allocator<char> *)&local_3d1);
      std::operator+((char *)in_stack_fffffffffffff7e8,in_stack_fffffffffffff7e0);
      local_41a = 0;
      local_41b = 0;
      bVar2 = false;
      if (local_c != 2) {
        std::allocator<char>::allocator();
        local_41a = 1;
        std::__cxx11::string::string(local_418,"/",&local_419);
        local_41b = 1;
        bVar3 = ends_with(in_stack_fffffffffffff7c0,(string *)in_stack_fffffffffffff7b8);
        bVar2 = false;
        if (!bVar3) {
          bVar2 = is_directory(in_stack_fffffffffffff830);
        }
      }
      if ((local_41b & 1) != 0) {
        std::__cxx11::string::~string(local_418);
      }
      if ((local_41a & 1) != 0) {
        std::allocator<char>::~allocator((allocator<char> *)&local_419);
      }
      if (bVar2 != false) {
        std::__cxx11::string::operator+=(local_3f8,"/");
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)in_stack_fffffffffffff7b0,in_stack_fffffffffffff7a8);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_440,"--title",&local_441);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)in_stack_fffffffffffff7a0,(value_type *)in_stack_fffffffffffff798);
      std::__cxx11::string::~string(local_440);
      std::allocator<char>::~allocator((allocator<char> *)&local_441);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)in_stack_fffffffffffff7b0,in_stack_fffffffffffff7a8);
      in_stack_fffffffffffff840 = (executor *)local_469;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)(local_469 + 1),"--separator=\n",(allocator *)in_stack_fffffffffffff840);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)in_stack_fffffffffffff7a0,(value_type *)in_stack_fffffffffffff798);
      std::__cxx11::string::~string((string *)(local_469 + 1));
      std::allocator<char>::~allocator((allocator<char> *)local_469);
      local_478 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)0x0;
      while (in_stack_fffffffffffff838 = local_478,
            sVar5 = std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::size(local_28),
            in_stack_fffffffffffff838 <
            (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)(sVar5 >> 1)) {
        paVar7 = &local_499;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_498,"--file-filter",paVar7);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)in_stack_fffffffffffff7a0,(value_type *)in_stack_fffffffffffff798);
        std::__cxx11::string::~string(local_498);
        std::allocator<char>::~allocator((allocator<char> *)&local_499);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator[](local_28,(long)local_478 * 2);
        std::operator+(in_stack_fffffffffffff7c8,(char *)in_stack_fffffffffffff7c0);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator[](local_28,(long)local_478 * 2 + 1);
        std::operator+(in_stack_fffffffffffff7a8,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_fffffffffffff7a0);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)in_stack_fffffffffffff7a0,(value_type *)in_stack_fffffffffffff798);
        std::__cxx11::string::~string(local_4c0);
        std::__cxx11::string::~string(local_4e0);
        local_478 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)((long)&(local_478->
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               )._M_impl.super__Vector_impl_data._M_start + 1);
      }
      if (local_c == 1) {
        paVar7 = &local_501;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_500,"--save",paVar7);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)in_stack_fffffffffffff7a0,(value_type *)in_stack_fffffffffffff798);
        std::__cxx11::string::~string(local_500);
        std::allocator<char>::~allocator((allocator<char> *)&local_501);
      }
      if (local_c == 2) {
        paVar7 = &local_529;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_528,"--directory",paVar7);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)in_stack_fffffffffffff7a0,(value_type *)in_stack_fffffffffffff798);
        std::__cxx11::string::~string(local_528);
        std::allocator<char>::~allocator((allocator<char> *)&local_529);
      }
      bVar2 = operator&(local_29,force_overwrite);
      if (!bVar2) {
        paVar7 = &local_551;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_550,"--confirm-overwrite",paVar7);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)in_stack_fffffffffffff7a0,(value_type *)in_stack_fffffffffffff798);
        std::__cxx11::string::~string(local_550);
        std::allocator<char>::~allocator((allocator<char> *)&local_551);
      }
      bVar2 = operator&(local_29,multiselect);
      if (bVar2) {
        paVar7 = &local_579;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_578,"--multiple",paVar7);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)in_stack_fffffffffffff7a0,(value_type *)in_stack_fffffffffffff798);
        std::__cxx11::string::~string(local_578);
        std::allocator<char>::~allocator((allocator<char> *)&local_579);
      }
      in_flag = (flag)((ulong)in_stack_fffffffffffff798 >> 0x20);
      std::__cxx11::string::~string(local_3f8);
    }
    else {
      bVar2 = pfd::settings::is_kdialog((settings *)0x19a5a4);
      if (bVar2) {
        if (local_c == 0) {
          in_stack_fffffffffffff7e8 = &local_5c9;
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_5c8,"--getopenfilename",in_stack_fffffffffffff7e8);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)in_stack_fffffffffffff7a0,(value_type *)in_stack_fffffffffffff798);
          std::__cxx11::string::~string(local_5c8);
          std::allocator<char>::~allocator((allocator<char> *)&local_5c9);
        }
        else if (local_c == 1) {
          paVar7 = &local_5a1;
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_5a0,"--getsavefilename",paVar7);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)in_stack_fffffffffffff7a0,(value_type *)in_stack_fffffffffffff798);
          std::__cxx11::string::~string(local_5a0);
          std::allocator<char>::~allocator((allocator<char> *)&local_5a1);
        }
        else if (local_c == 2) {
          in_stack_fffffffffffff7e0 =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_5f1;
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    ((string *)(local_5f1 + 1),"--getexistingdirectory",
                     (allocator *)in_stack_fffffffffffff7e0);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)in_stack_fffffffffffff7a0,(value_type *)in_stack_fffffffffffff798);
          std::__cxx11::string::~string((string *)(local_5f1 + 1));
          std::allocator<char>::~allocator((allocator<char> *)local_5f1);
        }
        bVar2 = operator&(local_29,multiselect);
        if (bVar2) {
          paVar7 = &local_619;
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_618,"--multiple",paVar7);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)in_stack_fffffffffffff7a0,(value_type *)in_stack_fffffffffffff798);
          std::__cxx11::string::~string(local_618);
          std::allocator<char>::~allocator((allocator<char> *)&local_619);
          paVar7 = &local_641;
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_640,"--separate-output",paVar7);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)in_stack_fffffffffffff7a0,(value_type *)in_stack_fffffffffffff798);
          std::__cxx11::string::~string(local_640);
          std::allocator<char>::~allocator((allocator<char> *)&local_641);
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)in_stack_fffffffffffff7b0,in_stack_fffffffffffff7a8);
        std::__cxx11::string::string(local_668);
        local_670 = (string *)0x0;
        while (in_stack_fffffffffffff7c0 = local_670,
              sVar5 = std::
                      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::size(local_28), in_stack_fffffffffffff7c0 < (string *)(sVar5 >> 1)) {
          in_stack_fffffffffffff7b8 = " | ";
          if (local_670 == (string *)0x0) {
            in_stack_fffffffffffff7b8 = "";
          }
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::operator[](local_28,(long)local_670 * 2);
          std::operator+((char *)in_stack_fffffffffffff7e8,in_stack_fffffffffffff7e0);
          std::operator+(in_stack_fffffffffffff7a8,(char *)in_stack_fffffffffffff7a0);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::operator[](local_28,(long)local_670 * 2 + 1);
          std::operator+(in_stack_fffffffffffff7a8,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         in_stack_fffffffffffff7a0);
          std::operator+(in_stack_fffffffffffff7a8,(char *)in_stack_fffffffffffff7a0);
          std::__cxx11::string::operator+=(local_668,(string *)&stack0xfffffffffffff970);
          std::__cxx11::string::~string((string *)&stack0xfffffffffffff970);
          std::__cxx11::string::~string(local_6b0);
          std::__cxx11::string::~string(local_6d0);
          std::__cxx11::string::~string(local_6f0);
          local_670 = (string *)&local_670->field_0x1;
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)in_stack_fffffffffffff7b0,in_stack_fffffffffffff7a8);
        in_stack_fffffffffffff7b0 = (string *)local_711;
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)(local_711 + 1),"--title",(allocator *)in_stack_fffffffffffff7b0);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)in_stack_fffffffffffff7a0,(value_type *)in_stack_fffffffffffff798);
        std::__cxx11::string::~string((string *)(local_711 + 1));
        std::allocator<char>::~allocator((allocator<char> *)local_711);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)in_stack_fffffffffffff7b0,in_stack_fffffffffffff7a8);
        std::__cxx11::string::~string(local_668);
      }
      in_flag = (flag)((ulong)in_stack_fffffffffffff798 >> 0x20);
    }
    goto LAB_0019ac7a;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_78,"set ret to choose",&local_79);
  std::allocator<char>::~allocator((allocator<char> *)&local_79);
  if (local_c == 0) {
LAB_00199243:
    std::__cxx11::string::operator+=(local_78," file");
    bVar2 = operator&(local_29,multiselect);
    if (bVar2) {
      std::__cxx11::string::operator+=(local_78," with multiple selections allowed");
    }
  }
  else if (local_c == 1) {
    std::__cxx11::string::operator+=(local_78," file name");
  }
  else {
    if (local_c != 2) goto LAB_00199243;
    std::__cxx11::string::operator+=(local_78," folder");
  }
  lVar4 = std::__cxx11::string::size();
  if (lVar4 != 0) {
    if ((local_c == 2) || (bVar2 = is_directory(in_stack_fffffffffffff830), bVar2)) {
      std::__cxx11::string::operator+=(local_78," default location ");
    }
    else {
      std::__cxx11::string::operator+=(local_78," default name ");
    }
    dialog::osascript_quote(in_stack_fffffffffffff828,in_stack_fffffffffffff820);
    std::__cxx11::string::operator+=(local_78,local_a0);
    std::__cxx11::string::~string(local_a0);
  }
  dialog::osascript_quote(in_stack_fffffffffffff828,in_stack_fffffffffffff820);
  std::operator+((char *)in_stack_fffffffffffff7a8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff7a0);
  std::__cxx11::string::operator+=(local_78,local_c0);
  std::__cxx11::string::~string(local_c0);
  std::__cxx11::string::~string(local_e0);
  if (local_c == 0) {
    std::__cxx11::string::string(local_100);
    for (local_108 = 0; uVar1 = local_108,
        sVar5 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::size(local_28), uVar1 < sVar5 >> 1; local_108 = local_108 + 1) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator[](local_28,local_108 * 2 + 1);
      std::operator+((char *)in_stack_fffffffffffff7e8,in_stack_fffffffffffff7e0);
      std::__cxx11::string::operator+=(local_100,local_128);
      std::__cxx11::string::~string(local_128);
    }
    std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
              ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)in_stack_fffffffffffff7e0,
               (char *)CONCAT17(in_stack_fffffffffffff7df,in_stack_fffffffffffff7d8),
               (flag_type)((ulong)in_stack_fffffffffffff7d0 >> 0x20));
    std::__cxx11::string::string(local_168);
    local_169 = 1;
    local_208 = std::__cxx11::string::begin();
    __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::__normal_iterator<char*>
              ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)in_stack_fffffffffffff7a0,
               (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)in_stack_fffffffffffff798);
    local_218 = std::__cxx11::string::end();
    __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::__normal_iterator<char*>
              ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)in_stack_fffffffffffff7a0,
               (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)in_stack_fffffffffffff798);
    __b._M_current._7_1_ = in_stack_fffffffffffff80f;
    __b._M_current._0_7_ = in_stack_fffffffffffff808;
    std::__cxx11::
    regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
    ::regex_token_iterator
              (in_stack_fffffffffffff800,in_stack_fffffffffffff810,__b,
               (regex_type *)CONCAT44(in_stack_fffffffffffff7fc,in_stack_fffffffffffff7f8),
               (int)((ulong)in_stack_fffffffffffff7f0 >> 0x20),
               (match_flag_type)in_stack_fffffffffffff7f0);
    std::__cxx11::
    regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
    ::regex_token_iterator(in_stack_fffffffffffff7a0);
    while (bVar2 = std::__cxx11::
                   regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
                   ::operator!=(in_stack_fffffffffffff7a0,in_stack_fffffffffffff798), bVar2) {
      std::__cxx11::
      regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
      ::operator->(&local_1f8);
      std::__cxx11::
      sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::str((sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)CONCAT17(in_stack_fffffffffffff7df,in_stack_fffffffffffff7d8));
      bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              in_stack_fffffffffffff7a0,(char *)in_stack_fffffffffffff798);
      if ((bVar2) ||
         (bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)in_stack_fffffffffffff7a0,(char *)in_stack_fffffffffffff798),
         bVar2)) {
        local_169 = 0;
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_2e0,"*.",&local_2e1);
        bVar2 = starts_with(in_stack_fffffffffffff7b0,in_stack_fffffffffffff7a8);
        std::__cxx11::string::~string(local_2e0);
        std::allocator<char>::~allocator((allocator<char> *)&local_2e1);
        if (bVar2) {
          std::__cxx11::string::size();
          std::__cxx11::string::substr((ulong)local_348,(ulong)local_2c0);
          dialog::osascript_quote(in_stack_fffffffffffff828,in_stack_fffffffffffff820);
          std::operator+((char *)in_stack_fffffffffffff7a8,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         in_stack_fffffffffffff7a0);
          std::__cxx11::string::operator+=(local_168,local_308);
          std::__cxx11::string::~string(local_308);
          std::__cxx11::string::~string(local_328);
          std::__cxx11::string::~string(local_348);
        }
      }
      std::__cxx11::string::~string(local_2c0);
      std::__cxx11::
      regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
      ::operator++(in_stack_fffffffffffff970);
    }
    if (((local_169 & 1) != 0) && (lVar4 = std::__cxx11::string::size(), lVar4 != 0)) {
      std::operator+((char *)in_stack_fffffffffffff7e8,in_stack_fffffffffffff7e0);
      std::operator+(in_stack_fffffffffffff7a8,(char *)in_stack_fffffffffffff7a0);
      std::__cxx11::string::operator+=(local_78,local_368);
      std::__cxx11::string::~string(local_368);
      std::__cxx11::string::~string(local_388);
    }
    std::__cxx11::
    regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
    ::~regex_token_iterator(in_stack_fffffffffffff7a0);
    std::__cxx11::
    regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
    ::~regex_token_iterator(in_stack_fffffffffffff7a0);
    std::__cxx11::string::~string(local_168);
    std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex
              ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)in_stack_fffffffffffff7a0);
    std::__cxx11::string::~string(local_100);
  }
  if ((local_c == 0) && (bVar2 = operator&(local_29,multiselect), bVar2)) {
    std::__cxx11::string::operator+=(local_78,"\nset s to \"\"");
    std::__cxx11::string::operator+=(local_78,"\nrepeat with i in ret");
    std::__cxx11::string::operator+=(local_78,"\n  set s to s & (POSIX path of i) & \"\\n\"");
    std::__cxx11::string::operator+=(local_78,"\nend repeat");
    std::__cxx11::string::operator+=(local_78,"\ncopy s to stdout");
  }
  else {
    std::__cxx11::string::operator+=(local_78,"\nPOSIX path of ret");
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_3a8,"-e",&local_3a9);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)in_stack_fffffffffffff7a0,(value_type *)in_stack_fffffffffffff798);
  in_flag = (flag)((ulong)in_stack_fffffffffffff798 >> 0x20);
  std::__cxx11::string::~string(local_3a8);
  std::allocator<char>::~allocator((allocator<char> *)&local_3a9);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)in_stack_fffffffffffff7b0,in_stack_fffffffffffff7a8);
  std::__cxx11::string::~string(local_78);
LAB_0019ac7a:
  pbVar6 = pfd::settings::flags((settings *)in_stack_fffffffffffff7a0,in_flag);
  if ((*pbVar6 & 1U) != 0) {
    std::operator<<((ostream *)&std::cerr,"pfd: ");
    this_00 = operator<<((ostream *)in_stack_fffffffffffff7c0,
                         (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)in_stack_fffffffffffff7b8);
    std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
  }
  std::__shared_ptr_access<pfd::internal::executor,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<pfd::internal::executor,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)0x19acf0);
  executor::start_process(in_stack_fffffffffffff840,in_stack_fffffffffffff838);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)in_stack_fffffffffffff7b0);
  return;
}

Assistant:

inline internal::file_dialog::file_dialog(type in_type,
            std::string const &title,
            std::string const &default_path /* = "" */,
            std::vector<std::string> const &filters /* = {} */,
            opt options /* = opt::none */)
{
#if _WIN32
    std::string filter_list;
    std::regex whitespace("  *");
    for (size_t i = 0; i + 1 < filters.size(); i += 2)
    {
        filter_list += filters[i] + '\0';
        filter_list += std::regex_replace(filters[i + 1], whitespace, ";") + '\0';
    }
    filter_list += '\0';

    m_async->start_func([this, in_type, title, default_path, filter_list,
                         options](int *exit_code) -> std::string
    {
        (void)exit_code;
        m_wtitle = internal::str2wstr(title);
        m_wdefault_path = internal::str2wstr(default_path);
        auto wfilter_list = internal::str2wstr(filter_list);

        // Initialise COM. This is required for the new folder selection window,
        // (see https://github.com/samhocevar/portable-file-dialogs/pull/21)
        // and to avoid random crashes with GetOpenFileNameW() (see
        // https://github.com/samhocevar/portable-file-dialogs/issues/51)
        ole32_dll ole32;

        // Folder selection uses a different method
        if (in_type == type::folder)
        {
#if PFD_HAS_IFILEDIALOG
            if (flags(flag::is_vista))
            {
                // On Vista and higher we should be able to use IFileDialog for folder selection
                IFileDialog *ifd;
                HRESULT hr = dll::proc<HRESULT WINAPI (REFCLSID, LPUNKNOWN, DWORD, REFIID, LPVOID *)>(ole32, "CoCreateInstance")
                                 (CLSID_FileOpenDialog, nullptr, CLSCTX_INPROC_SERVER, IID_PPV_ARGS(&ifd));

                // In case CoCreateInstance fails (which it should not), try legacy approach
                if (SUCCEEDED(hr))
                    return select_folder_vista(ifd, options & opt::force_path);
            }
#endif

            BROWSEINFOW bi;
            memset(&bi, 0, sizeof(bi));

            bi.lpfn = &bffcallback;
            bi.lParam = (LPARAM)this;

            if (flags(flag::is_vista))
            {
                if (ole32.is_initialized())
                    bi.ulFlags |= BIF_NEWDIALOGSTYLE;
                bi.ulFlags |= BIF_EDITBOX;
                bi.ulFlags |= BIF_STATUSTEXT;
            }

            auto *list = SHBrowseForFolderW(&bi);
            std::string ret;
            if (list)
            {
                auto buffer = new wchar_t[MAX_PATH];
                SHGetPathFromIDListW(list, buffer);
                dll::proc<void WINAPI (LPVOID)>(ole32, "CoTaskMemFree")(list);
                ret = internal::wstr2str(buffer);
                delete[] buffer;
            }
            return ret;
        }

        OPENFILENAMEW ofn;
        memset(&ofn, 0, sizeof(ofn));
        ofn.lStructSize = sizeof(OPENFILENAMEW);
        ofn.hwndOwner = GetActiveWindow();

        ofn.lpstrFilter = wfilter_list.c_str();

        auto woutput = std::wstring(MAX_PATH * 256, L'\0');
        ofn.lpstrFile = (LPWSTR)woutput.data();
        ofn.nMaxFile = (DWORD)woutput.size();
        if (!m_wdefault_path.empty())
        {
            // If a directory was provided, use it as the initial directory. If
            // a valid path was provided, use it as the initial file. Otherwise,
            // let the Windows API decide.
            auto path_attr = GetFileAttributesW(m_wdefault_path.c_str());
            if (path_attr != INVALID_FILE_ATTRIBUTES && (path_attr & FILE_ATTRIBUTE_DIRECTORY))
                ofn.lpstrInitialDir = m_wdefault_path.c_str();
            else if (m_wdefault_path.size() <= woutput.size())
                //second argument is size of buffer, not length of string
                StringCchCopyW(ofn.lpstrFile, MAX_PATH*256+1, m_wdefault_path.c_str());
            else
            {
                ofn.lpstrFileTitle = (LPWSTR)m_wdefault_path.data();
                ofn.nMaxFileTitle = (DWORD)m_wdefault_path.size();
            }
        }
        ofn.lpstrTitle = m_wtitle.c_str();
        ofn.Flags = OFN_NOCHANGEDIR | OFN_EXPLORER;

        dll comdlg32("comdlg32.dll");

        // Apply new visual style (required for windows XP)
        new_style_context ctx;

        if (in_type == type::save)
        {
            if (!(options & opt::force_overwrite))
                ofn.Flags |= OFN_OVERWRITEPROMPT;

            dll::proc<BOOL WINAPI (LPOPENFILENAMEW)> get_save_file_name(comdlg32, "GetSaveFileNameW");
            if (get_save_file_name(&ofn) == 0)
                return "";
            return internal::wstr2str(woutput.c_str());
        }
        else
        {
            if (options & opt::multiselect)
                ofn.Flags |= OFN_ALLOWMULTISELECT;
            ofn.Flags |= OFN_PATHMUSTEXIST;

            dll::proc<BOOL WINAPI (LPOPENFILENAMEW)> get_open_file_name(comdlg32, "GetOpenFileNameW");
            if (get_open_file_name(&ofn) == 0)
                return "";
        }

        std::string prefix;
        for (wchar_t const *p = woutput.c_str(); *p; )
        {
            auto filename = internal::wstr2str(p);
            p += wcslen(p);
            // In multiselect mode, we advance p one wchar further and
            // check for another filename. If there is one and the
            // prefix is empty, it means we just read the prefix.
            if ((options & opt::multiselect) && *++p && prefix.empty())
            {
                prefix = filename + "/";
                continue;
            }

            m_vector_result.push_back(prefix + filename);
        }

        return "";
    });
#elif __EMSCRIPTEN__
    // FIXME: do something
    (void)in_type;
    (void)title;
    (void)default_path;
    (void)filters;
    (void)options;
#else
    auto command = desktop_helper();

    if (is_osascript())
    {
        std::string script = "set ret to choose";
        switch (in_type)
        {
            case type::save:
                script += " file name";
                break;
            case type::open: default:
                script += " file";
                if (options & opt::multiselect)
                    script += " with multiple selections allowed";
                break;
            case type::folder:
                script += " folder";
                break;
        }

        if (default_path.size())
        {
            if (in_type == type::folder || is_directory(default_path))
                script += " default location ";
            else
                script += " default name ";
            script += osascript_quote(default_path);
        }

        script += " with prompt " + osascript_quote(title);

        if (in_type == type::open)
        {
            // Concatenate all user-provided filter patterns
            std::string patterns;
            for (size_t i = 0; i < filters.size() / 2; ++i)
                patterns += " " + filters[2 * i + 1];

            // Split the pattern list to check whether "*" is in there; if it
            // is, we have to disable filters because there is no mechanism in
            // OS X for the user to override the filter.
            std::regex sep("\\s+");
            std::string filter_list;
            bool has_filter = true;
            std::sregex_token_iterator iter(patterns.begin(), patterns.end(), sep, -1);
            std::sregex_token_iterator end;
            for ( ; iter != end; ++iter)
            {
                auto pat = iter->str();
                if (pat == "*" || pat == "*.*")
                    has_filter = false;
                else if (internal::starts_with(pat, "*."))
                    filter_list += "," + osascript_quote(pat.substr(2, pat.size() - 2));
            }

            if (has_filter && filter_list.size() > 0)
            {
                // There is a weird AppleScript bug where file extensions of length != 3 are
                // ignored, e.g. type{"txt"} works, but type{"json"} does not. Fortunately if
                // the whole list starts with a 3-character extension, everything works again.
                // We use "///" for such an extension because we are sure it cannot appear in
                // an actual filename.
                script += " of type {\"///\"" + filter_list + "}";
            }
        }

        if (in_type == type::open && (options & opt::multiselect))
        {
            script += "\nset s to \"\"";
            script += "\nrepeat with i in ret";
            script += "\n  set s to s & (POSIX path of i) & \"\\n\"";
            script += "\nend repeat";
            script += "\ncopy s to stdout";
        }
        else
        {
            script += "\nPOSIX path of ret";
        }

        command.push_back("-e");
        command.push_back(script);
    }
    else if (is_zenity())
    {
        command.push_back("--file-selection");

        // If the default path is a directory, make sure it ends with "/" otherwise zenity will
        // open the file dialog in the parent directory.
        auto filename_arg = "--filename=" + default_path;
        if (in_type != type::folder && !ends_with(default_path, "/") && internal::is_directory(default_path))
            filename_arg += "/";
        command.push_back(filename_arg);

        command.push_back("--title");
        command.push_back(title);
        command.push_back("--separator=\n");

        for (size_t i = 0; i < filters.size() / 2; ++i)
        {
            command.push_back("--file-filter");
            command.push_back(filters[2 * i] + "|" + filters[2 * i + 1]);
        }

        if (in_type == type::save)
            command.push_back("--save");
        if (in_type == type::folder)
            command.push_back("--directory");
        if (!(options & opt::force_overwrite))
            command.push_back("--confirm-overwrite");
        if (options & opt::multiselect)
            command.push_back("--multiple");
    }
    else if (is_kdialog())
    {
        switch (in_type)
        {
            case type::save: command.push_back("--getsavefilename"); break;
            case type::open: command.push_back("--getopenfilename"); break;
            case type::folder: command.push_back("--getexistingdirectory"); break;
        }
        if (options & opt::multiselect)
        {
            command.push_back("--multiple");
            command.push_back("--separate-output");
        }

        command.push_back(default_path);

        std::string filter;
        for (size_t i = 0; i < filters.size() / 2; ++i)
            filter += (i == 0 ? "" : " | ") + filters[2 * i] + "(" + filters[2 * i + 1] + ")";
        command.push_back(filter);

        command.push_back("--title");
        command.push_back(title);
    }

    if (flags(flag::is_verbose))
        std::cerr << "pfd: " << command << std::endl;

    m_async->start_process(command);
#endif
}